

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O3

void chacha_consume(chacha_state_internal *state,uint8_t *in,uint8_t *out,size_t inlen)

{
  uint8_t *__src;
  uint8_t *in_00;
  uint8_t *out_00;
  uint8_t *__dest;
  size_t __n;
  uint8_t buffer [1024];
  uint8_t local_438 [1032];
  
  if (inlen != 0) {
    __src = in;
    __dest = out;
    if ((((uint)out | (uint)in) & 7) == 0) {
      chacha_blocks_ref((chacha_state_conflict *)state,in,out,inlen);
      return;
    }
    do {
      __n = 0x400;
      if (inlen < 0x400) {
        __n = inlen;
      }
      out_00 = local_438;
      if (((ulong)out & 7) == 0) {
        out_00 = __dest;
      }
      in_00 = __src;
      if (((ulong)in & 7) != 0) {
        memcpy(local_438,__src,__n);
        in_00 = local_438;
      }
      chacha_blocks_ref((chacha_state_conflict *)state,in_00,out_00,__n);
      if (((ulong)out & 7) != 0) {
        memcpy(__dest,local_438,__n);
      }
      if (__src != (uint8_t *)0x0) {
        __src = __src + __n;
      }
      inlen = inlen - __n;
      __dest = __dest + __n;
    } while (inlen != 0);
  }
  return;
}

Assistant:

static void
chacha_consume(chacha_state_internal *state, const uint8_t *in, uint8_t *out, size_t inlen) {
    uint8_t buffer[16 * CHACHA_BLOCKBYTES];
    int in_aligned, out_aligned;

    /* it's ok to call with 0 bytes */
    if (!inlen)
        return;

    /* if everything is aligned, handle directly */
    in_aligned = chacha_is_aligned(in);
    out_aligned = chacha_is_aligned(out);
    if (in_aligned && out_aligned) {
        chacha_blocks_ref(state, in, out, inlen);
        return;
    }

    /* copy the unaligned data to an aligned buffer and process in chunks */
    while (inlen) {
        const size_t bytes = (inlen > sizeof(buffer)) ? sizeof(buffer) : inlen;
        const uint8_t *src = in;
        uint8_t *dst = (out_aligned) ? out : buffer;
        if (!in_aligned) {
            memcpy(buffer, in, bytes);
            src = buffer;
        }
        chacha_blocks_ref(state, src, dst, bytes);
        if (!out_aligned)
            memcpy(out, buffer, bytes);
        if (in) in += bytes;
        out += bytes;
        inlen -= bytes;
    }
}